

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_scs_8_pd(void)

{
  uint address;
  
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 1;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,(int)(m68ki_cpu.c_flag << 0x17) >> 0x1f & 0xff);
  return;
}

Assistant:

static void m68k_op_scs_8_pd(void)
{
	m68ki_write_8(EA_AY_PD_8(), COND_CS() ? 0xff : 0);
}